

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::utils::FloatProxy<double>::GetWords
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FloatProxy<double> *this)

{
  uint32_t uVar1;
  uint_type uVar2;
  value_type_conflict local_34;
  value_type_conflict local_30;
  value_type_conflict local_2c;
  uint_type local_28;
  uint_type d;
  FloatProxy<double> *local_18;
  FloatProxy<double> *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words;
  
  d._7_1_ = 0;
  local_18 = this;
  this_local = (FloatProxy<double> *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  uVar1 = FloatProxyTraits<double>::width();
  if (uVar1 == 0x40) {
    local_28 = data(this);
    local_2c = (value_type_conflict)local_28;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_2c);
    local_30 = (value_type_conflict)(local_28 >> 0x20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_30);
  }
  else {
    uVar2 = data(this);
    local_34 = (value_type_conflict)uVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> GetWords() const {
    std::vector<uint32_t> words;
    if (FloatProxyTraits<T>::width() == 64) {
      FloatProxyTraits<double>::uint_type d = data();
      words.push_back(static_cast<uint32_t>(d));
      words.push_back(static_cast<uint32_t>(d >> 32));
    } else {
      words.push_back(static_cast<uint32_t>(data()));
    }
    return words;
  }